

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O1

char * TEST_cargo_static_list_alloced_items(void)

{
  int iVar1;
  char *pcVar2;
  cargo_t cargo;
  size_t input_count;
  char *inputs [5];
  char *args [4];
  
  iVar1 = cargo_init(&cargo,0,"program");
  if (iVar1 == 0) {
    input_count = 0;
    args[2] = "abc";
    args[3] = "def";
    args[0]._0_4_ = 0x12b24c;
    args[0]._4_4_ = 0;
    args[1]._0_4_ = 0x12ac7e;
    args[1]._4_4_ = 0;
    iVar1 = cargo_add_option(cargo,0,"--template --input",(char *)0x0,".[s]+",inputs,&input_count,5)
    ;
    if (iVar1 == 0) {
      iVar1 = cargo_parse(cargo,0,1,4,args);
      if (iVar1 == 0) {
        pcVar2 = "Expected inputs[0] == \'abc\'";
        if ((((inputs[0] != (char *)0x0) && (iVar1 = strcmp(inputs[0],"abc"), iVar1 == 0)) &&
            (pcVar2 = "Expected inputs[0] == \'def\'", inputs[1] != (char *)0x0)) &&
           ((iVar1 = strcmp(inputs[1],"def"), iVar1 == 0 && (pcVar2 = (char *)0x0, input_count != 2)
            ))) {
          pcVar2 = "Expected two inputs";
        }
      }
      else {
        pcVar2 = "Parse failed";
      }
    }
    else {
      pcVar2 = "Failed to add option";
    }
    free(inputs[0]);
    free(inputs[1]);
    cargo_destroy(&cargo);
  }
  else {
    pcVar2 = "Failed to init cargo";
  }
  return pcVar2;
}

Assistant:

_TEST_START(TEST_cargo_static_list_alloced_items)
{
    #define MAX_INPUT_TEMPLATES 5
    char *inputs[MAX_INPUT_TEMPLATES];
    size_t input_count = 0;
    char *args[] = { "catcierge", "--input", "abc", "def" };

    ret |= cargo_add_option(cargo, 0,
            "--template --input", NULL,
            ".[s]+", &inputs, &input_count, MAX_INPUT_TEMPLATES);
    cargo_assert(ret == 0, "Failed to add option");

    ret = cargo_parse(cargo, 0, 1, sizeof(args) / sizeof(args[0]), args);
    cargo_assert(ret == 0, "Parse failed");
    cargo_assert(inputs[0] && !strcmp(inputs[0], "abc"),
        "Expected inputs[0] == 'abc'");
    cargo_assert(inputs[1] && !strcmp(inputs[1], "def"),
        "Expected inputs[0] == 'def'");
    cargo_assert(input_count == 2, "Expected two inputs");

    _TEST_CLEANUP();
    free(inputs[0]);
    free(inputs[1]);
}